

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O1

void Ssw_RarManAssingRandomPis(Ssw_RarMan_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  word wVar4;
  long lVar5;
  ulong uVar6;
  word *pwVar7;
  
  pAVar3 = p->pAig;
  if (0 < pAVar3->nTruePis) {
    uVar6 = 0;
    do {
      if ((long)pAVar3->vCis->nSize <= (long)uVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = *(int *)((long)pAVar3->vCis->pArray[uVar6] + 0x24);
      if (pAVar3->vObjs->nSize <= iVar1) {
        __assert_fail("Id < Aig_ManObjNumMax(p->pAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                      ,0x53,"word *Ssw_RarObjSim(Ssw_RarMan_t *, int)");
      }
      iVar2 = p->pPars->nWords;
      pwVar7 = p->pObjData + iVar1 * iVar2;
      if (0 < iVar2) {
        lVar5 = 0;
        do {
          wVar4 = Aig_ManRandom64(0);
          pwVar7[lVar5] = wVar4;
          lVar5 = lVar5 + 1;
        } while (lVar5 < p->pPars->nWords);
      }
      *pwVar7 = *pwVar7 * 0x10 + (ulong)((uVar6 & 1) == 0) * 2 + 10;
      uVar6 = uVar6 + 1;
      pAVar3 = p->pAig;
    } while ((long)uVar6 < (long)pAVar3->nTruePis);
  }
  return;
}

Assistant:

void Ssw_RarManAssingRandomPis( Ssw_RarMan_t * p )
{
    word * pSim;
    Aig_Obj_t * pObj;
    int w, i;
    Saig_ManForEachPi( p->pAig, pObj, i )
    {
        pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
        for ( w = 0; w < p->pPars->nWords; w++ )
            pSim[w] = Aig_ManRandom64(0);
//        pSim[0] <<= 1;
//        pSim[0] = (pSim[0] << 2) | 2;
        pSim[0] = (pSim[0] << 4) | ((i & 1) ? 0xA : 0xC);
    }
}